

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TaprootScriptTree *tap_tree)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  TaprootScriptTree *local_18;
  TaprootScriptTree *tap_tree_local;
  TaprootScriptTree *this_local;
  
  local_18 = tap_tree;
  tap_tree_local = this;
  TapBranch::TapBranch(&this->super_TapBranch,&tap_tree->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_009f2638;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&this->nodes_);
  bVar1 = TaprootUtil::IsValidLeafVersion((local_18->super_TapBranch).leaf_version_);
  if (!bVar1) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x23b;
    local_40.funcname = "TaprootScriptTree";
    logger::warn<unsigned_char_const&>
              (&local_40,"Unsupported leaf version. [{}]",&(local_18->super_TapBranch).leaf_version_
              );
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"Unsupported leaf version.",&local_61);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_60);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (this->super_TapBranch).has_leaf_ = (bool)((local_18->super_TapBranch).has_leaf_ & 1);
  (this->super_TapBranch).leaf_version_ = (local_18->super_TapBranch).leaf_version_;
  Script::operator=(&(this->super_TapBranch).script_,&(local_18->super_TapBranch).script_);
  ByteData256::operator=
            (&(this->super_TapBranch).root_commitment_,&(local_18->super_TapBranch).root_commitment_
            );
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&(this->super_TapBranch).branch_list_,&(local_18->super_TapBranch).branch_list_);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
            (&this->nodes_,&local_18->nodes_);
  (this->super_TapBranch).is_elements_ = (bool)((local_18->super_TapBranch).is_elements_ & 1);
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TaprootScriptTree& tap_tree)
    : TapBranch(tap_tree) {
  if (!TaprootUtil::IsValidLeafVersion(tap_tree.leaf_version_)) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        tap_tree.leaf_version_);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
  nodes_ = tap_tree.nodes_;
  is_elements_ = tap_tree.is_elements_;
}